

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O1

void xPredIntraAngAdi_X_8(pel *pSrc,pel *dst,int i_dst,int uiDirMode,int iWidth,int iHeight)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  pel first_line [192];
  undefined4 local_fc;
  undefined1 auStack_f8 [200];
  
  uVar7 = iHeight / 2;
  uVar8 = (uVar7 + iWidth) - 1;
  uVar10 = iWidth * 2 + 1;
  uVar6 = uVar10;
  if ((int)uVar8 < (int)uVar10) {
    uVar6 = uVar8;
  }
  lVar11 = (long)(int)(uVar7 + iWidth + 0xe & 0xfffffff0);
  if ((int)uVar6 < 1) {
    uVar12 = 0;
  }
  else {
    uVar12 = 0;
    do {
      bVar1 = pSrc[uVar12 + 1];
      bVar2 = pSrc[uVar12 + 2];
      bVar3 = pSrc[uVar12 + 3];
      auStack_f8[uVar12] =
           (char)(((uint)bVar2 + (uint)bVar1) * 3 + (uint)pSrc[uVar12] + (uint)bVar3 + 4 >> 3);
      auStack_f8[uVar12 + lVar11] = (char)((uint)bVar3 + (uint)bVar1 + (uint)bVar2 * 2 + 2 >> 2);
      uVar12 = uVar12 + 1;
      local_fc = uVar10;
    } while (uVar6 != uVar12);
  }
  if ((int)uVar10 < (int)uVar8) {
    lVar9 = (long)(int)uVar6;
    uVar4 = auStack_f8[lVar9 + lVar11 + -2];
    auStack_f8[lVar9 + lVar11 + -1] = uVar4;
    if ((int)uVar12 < (int)uVar8) {
      uVar5 = auStack_f8[lVar9 + -1];
      uVar12 = uVar12 & 0xffffffff;
      do {
        auStack_f8[uVar12] = uVar5;
        auStack_f8[uVar12 + lVar11] = uVar4;
        uVar12 = uVar12 + 1;
      } while (uVar8 != uVar12);
    }
  }
  if (1 < iHeight) {
    uVar12 = 0;
    do {
      memcpy(dst,auStack_f8 + uVar12,(long)iWidth);
      memcpy(dst + i_dst,auStack_f8 + uVar12 + lVar11,(long)iWidth);
      dst = dst + i_dst * 2;
      uVar12 = uVar12 + 1;
    } while (uVar7 != uVar12);
  }
  return;
}

Assistant:

static void xPredIntraAngAdi_X_8(pel *pSrc, pel *dst, int i_dst, int uiDirMode, int iWidth, int iHeight)
{
    ALIGNED_16(pel first_line[2 * (64 + 32)]);
    int line_size = iWidth + iHeight / 2 - 1;
    int real_size = min(line_size, iWidth * 2 + 1);
    int i;
    int aligned_line_size = ((line_size + 15) >> 4) << 4;
    pel *pfirst[2] = { first_line, first_line + aligned_line_size };

    for (i = 0; i < real_size; i++, pSrc++) {
        pfirst[0][i] = (pSrc[0] + (pSrc[1] + pSrc[2]) * 3 + pSrc[3] + 4) >> 3;
        pfirst[1][i] = (pSrc[1] + pSrc[2] * 2 + pSrc[3] + 2) >> 2;
    }

    // padding
    if (real_size < line_size) {
        int pad1, pad2;

        pfirst[1][real_size - 1] = pfirst[1][real_size - 2];

        pad1 = pfirst[0][real_size - 1];
        pad2 = pfirst[1][real_size - 1];
        for (; i < line_size; i++) {
            pfirst[0][i] = pad1;
            pfirst[1][i] = pad2;
        }
    }

    iHeight /= 2;

    for (i = 0; i < iHeight; i++) {
        memcpy(dst, pfirst[0] + i, iWidth * sizeof(pel));
        memcpy(dst + i_dst, pfirst[1] + i, iWidth * sizeof(pel));
        dst += i_dst * 2;
    }
}